

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3.c
# Opt level: O0

int main(void)

{
  int step;
  int upper;
  int lower;
  float celcius;
  float fahr;
  
  printf("%5s\t%6s\n","Fahr","Celc");
  for (lower = 0; (float)lower <= 300.0; lower = (int)((float)lower + 20.0)) {
    printf("%5.0f\t%6.1f\n",(double)(float)lower,(double)(((float)lower - 32.0) * 0.5555556));
  }
  return 0;
}

Assistant:

int main()
{
    float fahr, celcius;
    int lower, upper, step;

    lower = 0;
    upper = 300;
    step = 20;

    fahr = lower;

    printf("%5s\t%6s\n", "Fahr", "Celc");
    while (fahr <= upper) {
        celcius = (5.0/9.0) * (fahr - 32.0);
        printf("%5.0f\t%6.1f\n", fahr, celcius);
        fahr = fahr + step;
    }
}